

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O2

ssize_t __thiscall
helics::CommonCore::send(CommonCore *this,int __fd,void *__buf,size_t __n,int __flags)

{
  atomic<int> *paVar1;
  int iVar2;
  size_t sVar3;
  string_view string3;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  FederateState *this_00;
  ssize_t extraout_RAX;
  InvalidIdentifier *this_01;
  char *pcVar5;
  string_view message_00;
  string_view string2;
  size_t sStackY_130;
  vector<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
  targets;
  ActionMessage message;
  
  ppVar4 = getHandleInfo(this,(InterfaceHandle)__fd);
  if (ppVar4 == (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)0x0) {
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar5 = "handle is not valid";
    sStackY_130 = 0x13;
  }
  else {
    if (*(char *)((long)&(ppVar4->first)._M_string_length + 4) == 'e') {
      this_00 = getFederateAt(this,(LocalFederateId)(BaseType)(ppVar4->first)._M_string_length);
      FederateState::getMessageDestinations(&targets,this_00,(InterfaceHandle)__fd);
      if (targets.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          targets.
          super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        ActionMessage::ActionMessage(&message,cmd_send_message);
        message.source_id.gid = *(BaseType *)&(ppVar4->first)._M_dataplus._M_p;
        message.actionTime.internalTimeCode = (this_00->allowed_send_time).internalTimeCode;
        message.source_handle.hid = __fd;
        SmallBuffer::assign(&message.payload,__buf,__n);
        LOCK();
        paVar1 = &this->messageCounter;
        iVar2 = (paVar1->super___atomic_base<int>)._M_i;
        (paVar1->super___atomic_base<int>)._M_i = (paVar1->super___atomic_base<int>)._M_i + 1;
        UNLOCK();
        message.messageID = iVar2 + 1;
        pcVar5 = (char *)(ppVar4->first).field_2._M_allocated_capacity;
        sVar3 = *(size_t *)((long)&(ppVar4->first).field_2 + 8);
        string3._M_str = pcVar5;
        string3._M_len = sVar3;
        string2._M_str = pcVar5;
        string2._M_len = sVar3;
        ActionMessage::setStringData
                  (&message,(string_view)(ZEXT816(0x3ac614) << 0x40),string2,string3);
        generateMessages(this,&message,&targets);
        ActionMessage::~ActionMessage(&message);
      }
      std::
      _Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
      ::~_Vector_base(&targets.
                       super__Vector_base<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<helics::GlobalHandle,_std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                     );
      return extraout_RAX;
    }
    this_01 = (InvalidIdentifier *)__cxa_allocate_exception(0x28);
    pcVar5 = "handle does not point to an endpoint";
    sStackY_130 = 0x24;
  }
  message_00._M_str = pcVar5;
  message_00._M_len = sStackY_130;
  InvalidIdentifier::InvalidIdentifier(this_01,message_00);
  __cxa_throw(this_01,&InvalidIdentifier::typeinfo,HelicsException::~HelicsException);
}

Assistant:

void CommonCore::send(InterfaceHandle sourceHandle, const void* data, uint64_t length)
{
    const auto* hndl = getHandleInfo(sourceHandle);
    if (hndl == nullptr) {
        throw(InvalidIdentifier("handle is not valid"));
    }
    if (hndl->handleType != InterfaceType::ENDPOINT) {
        throw(InvalidIdentifier("handle does not point to an endpoint"));
    }
    auto* fed = getFederateAt(hndl->local_fed_id);
    auto targets = fed->getMessageDestinations(sourceHandle);
    if (targets.empty()) {
        return;
    }

    ActionMessage message(CMD_SEND_MESSAGE);
    message.source_handle = sourceHandle;
    message.source_id = hndl->getFederateId();
    message.actionTime = fed->nextAllowedSendTime();
    message.payload.assign(data, length);
    message.messageID = ++messageCounter;
    message.setStringData("", hndl->key, hndl->key);
    generateMessages(message, targets);
}